

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

string * deqp::gles2::Performance::mandelbrotVertexTemplate_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_19;
  char *local_18;
  char *resultTemplate;
  
  local_18 = 
  "uniform highp mat4 u_mvp${NAME_SPEC};\n\nattribute highp vec4 a_vertex${NAME_SPEC};\nattribute highp vec4 a_coord${NAME_SPEC};\n\nvarying mediump vec2 v_coord${NAME_SPEC};\n\nvoid main(void)\n{\n\tgl_Position = u_mvp${NAME_SPEC} * a_vertex${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\n\tfloat xMin = -2.0;\n\tfloat xMax = +0.5;\n\tfloat yMin = -1.5;\n\tfloat yMax = +1.5;\n\n\tv_coord${NAME_SPEC}.x = a_coord${NAME_SPEC}.x * (xMax - xMin) + xMin;\n\tv_coord${NAME_SPEC}.y = a_coord${NAME_SPEC}.y * (yMax - yMin) + yMin;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             "uniform highp mat4 u_mvp${NAME_SPEC};\n\nattribute highp vec4 a_vertex${NAME_SPEC};\nattribute highp vec4 a_coord${NAME_SPEC};\n\nvarying mediump vec2 v_coord${NAME_SPEC};\n\nvoid main(void)\n{\n\tgl_Position = u_mvp${NAME_SPEC} * a_vertex${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\n\tfloat xMin = -2.0;\n\tfloat xMax = +0.5;\n\tfloat yMin = -1.5;\n\tfloat yMax = +1.5;\n\n\tv_coord${NAME_SPEC}.x = a_coord${NAME_SPEC}.x * (xMax - xMin) + xMin;\n\tv_coord${NAME_SPEC}.y = a_coord${NAME_SPEC}.y * (yMax - yMin) + yMin;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return in_RDI;
}

Assistant:

static string mandelbrotVertexTemplate (void)
{
	const char* resultTemplate =
		"uniform highp mat4 u_mvp${NAME_SPEC};\n"
		"\n"
		"attribute highp vec4 a_vertex${NAME_SPEC};\n"
		"attribute highp vec4 a_coord${NAME_SPEC};\n"
		"\n"
		"varying mediump vec2 v_coord${NAME_SPEC};\n"
		"\n"
		"void main(void)\n"
		"{\n"
		"	gl_Position = u_mvp${NAME_SPEC} * a_vertex${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"\n"
		"	float xMin = -2.0;\n"
		"	float xMax = +0.5;\n"
		"	float yMin = -1.5;\n"
		"	float yMax = +1.5;\n"
		"\n"
		"	v_coord${NAME_SPEC}.x = a_coord${NAME_SPEC}.x * (xMax - xMin) + xMin;\n"
		"	v_coord${NAME_SPEC}.y = a_coord${NAME_SPEC}.y * (yMax - yMin) + yMin;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}